

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

void Bal_ManFree(Bal_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  int *__ptr_01;
  int iVar1;
  long lVar2;
  
  __ptr = p->vCutSets;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar1 = __ptr->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar2]) {
          free(__ptr->pArray[lVar2]);
          iVar1 = __ptr->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  __ptr_00 = p->vCosts;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (int *)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

void Bal_ManFree( Bal_Man_t * p )
{
    Vec_PtrFreeFree( p->vCutSets );
    Vec_IntFree( p->vCosts );
    ABC_FREE( p );
}